

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_line(int nargs,char **args)

{
  uint uVar1;
  undefined8 *in_RSI;
  int in_EDI;
  int id;
  int n;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  
  uVar1 = lookup_keyword((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  printf("%s(%d)",*in_RSI,(ulong)uVar1);
  for (iVar2 = 1; iVar2 < in_EDI; iVar2 = iVar2 + 1) {
    printf(" \'%s\'",in_RSI[iVar2]);
  }
  printf("\n");
  return;
}

Assistant:

void parse_line(int nargs, char **args)
{
    int n;
    int id = lookup_keyword(args[0]);
    printf("%s(%d)", args[0], id);
    for (n = 1; n < nargs; n++) {
        printf(" '%s'", args[n]);
    }
    printf("\n");
}